

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> * __thiscall
CfgNode::BlockData::calls
          (set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *__return_storage_ptr__,
          BlockData *this)

{
  iterator iVar1;
  const_iterator __position;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr local_40;
  _Alloc_node local_38;
  
  __position._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_calls)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_40 = p_Var2[1]._M_parent;
      local_38._M_t = &__return_storage_ptr__->_M_t;
      iVar1 = std::
              _Rb_tree<CfgCall*,CfgCall*,std::_Identity<CfgCall*>,std::less<CfgCall*>,std::allocator<CfgCall*>>
              ::
              _M_insert_unique_<CfgCall*,std::_Rb_tree<CfgCall*,CfgCall*,std::_Identity<CfgCall*>,std::less<CfgCall*>,std::allocator<CfgCall*>>::_Alloc_node>
                        ((_Rb_tree<CfgCall*,CfgCall*,std::_Identity<CfgCall*>,std::less<CfgCall*>,std::allocator<CfgCall*>>
                          *)__return_storage_ptr__,__position,(CfgCall **)&local_40,&local_38);
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgCall*> CfgNode::BlockData::calls() const {
	std::set<CfgCall*> cfgCalls;

	std::transform(m_calls.begin(), m_calls.end(),
			std::inserter(cfgCalls, cfgCalls.begin()),
			[](const std::map<Addr, CfgCall*>::value_type &pair) {
					return pair.second;
			}
	);

	return cfgCalls;
}